

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

void __thiscall deqp::gls::anon_unknown_1::AttributeArray::~AttributeArray(AttributeArray *this)

{
  deUint32 err;
  
  if (this->m_storage == STORAGE_USER) {
    if (this->m_data != (char *)0x0) {
      operator_delete__(this->m_data);
      return;
    }
  }
  else if (this->m_storage == STORAGE_BUFFER) {
    (*this->m_ctx->_vptr_Context[0x27])(this->m_ctx,1,&this->m_glBuffer);
    err = (*this->m_ctx->_vptr_Context[0x79])();
    glu::checkError(err,"glDeleteBuffers()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsDrawTest.cpp"
                    ,0x3c3);
  }
  return;
}

Assistant:

AttributeArray::~AttributeArray	(void)
{
	if (m_storage == DrawTestSpec::STORAGE_BUFFER)
	{
		m_ctx.deleteBuffers(1, &m_glBuffer);
		GLU_EXPECT_NO_ERROR(m_ctx.getError(), "glDeleteBuffers()");
	}
	else if (m_storage == DrawTestSpec::STORAGE_USER)
		delete[] m_data;
	else
		DE_ASSERT(false);
}